

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForkNode.cpp
# Opt level: O0

bool __thiscall ForkNode::removeForkSuccessor(ForkNode *this,EntryNode *entryNode)

{
  size_type sVar1;
  long in_RSI;
  set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_> *in_RDI;
  set<EntryNode_*,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_> *in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    std::set<EntryNode_*,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_>::erase
              (in_stack_ffffffffffffffe0,(key_type *)in_RDI);
    sVar1 = std::set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_>::erase
                      (in_RDI,(key_type *)in_RDI);
    local_1 = sVar1 != 0;
  }
  return local_1;
}

Assistant:

bool ForkNode::removeForkSuccessor(EntryNode *entryNode) {
    if (!entryNode) {
        return false;
    }
    forkSuccessors_.erase(entryNode);
    return entryNode->forkPredecessors_.erase(this);
}